

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

int __thiscall
nlohmann::detail::
lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
::get_codepoint(lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                *this)

{
  undefined4 uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  undefined8 local_38;
  undefined8 uStack_30;
  
  if (this->current != 0x75) {
    __assert_fail("current == \'u\'",
                  "/workspace/llm4binary/github/license_c_cmakelists/yig[P]graphics101-pipeline/include/json.hpp"
                  ,0x91c,
                  "int nlohmann::detail::lexer<nlohmann::basic_json<>>::get_codepoint() [BasicJsonType = nlohmann::basic_json<>]"
                 );
  }
  local_38 = 0x80000000c;
  uStack_30 = 4;
  lVar5 = 0;
  uVar4 = 0;
  do {
    if (lVar5 == 0x10) {
      if (uVar4 < 0x10000) {
        return uVar4;
      }
      __assert_fail("0x0000 <= codepoint and codepoint <= 0xFFFF",
                    "/workspace/llm4binary/github/license_c_cmakelists/yig[P]graphics101-pipeline/include/json.hpp"
                    ,0x936,
                    "int nlohmann::detail::lexer<nlohmann::basic_json<>>::get_codepoint() [BasicJsonType = nlohmann::basic_json<>]"
                   );
    }
    uVar1 = *(undefined4 *)((long)&local_38 + lVar5);
    get(this);
    iVar2 = this->current;
    uVar3 = iVar2 - 0x30;
    if (9 < uVar3) {
      if (iVar2 - 0x41U < 6) {
        uVar3 = iVar2 - 0x37;
      }
      else {
        if (5 < iVar2 - 0x61U) {
          return -1;
        }
        uVar3 = iVar2 - 0x57;
      }
    }
    uVar4 = uVar4 + (uVar3 << ((byte)uVar1 & 0x1f));
    lVar5 = lVar5 + 4;
  } while( true );
}

Assistant:

int get_codepoint()
    {
        // this function only makes sense after reading `\u`
        assert(current == 'u');
        int codepoint = 0;

        const auto factors = { 12, 8, 4, 0 };
        for (const auto factor : factors)
        {
            get();

            if (current >= '0' and current <= '9')
            {
                codepoint += ((current - 0x30) << factor);
            }
            else if (current >= 'A' and current <= 'F')
            {
                codepoint += ((current - 0x37) << factor);
            }
            else if (current >= 'a' and current <= 'f')
            {
                codepoint += ((current - 0x57) << factor);
            }
            else
            {
                return -1;
            }
        }

        assert(0x0000 <= codepoint and codepoint <= 0xFFFF);
        return codepoint;
    }